

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O3

void sarima_summary(sarima_object obj)

{
  long lVar1;
  double dVar2;
  int iVar3;
  char *pcVar4;
  int iVar5;
  long lVar6;
  double dVar7;
  
  iVar3 = obj->q + obj->p + obj->P + obj->Q + obj->M;
  if ((uint)obj->method < 2) {
    puts("\n\nExit Status ");
    printf("Return Code : %d \n",(ulong)(uint)obj->retval);
    printf("Exit Message : ");
    iVar5 = obj->retval;
    if (iVar5 < 4) {
      if (iVar5 == 0) {
        pcVar4 = "Input Error";
      }
      else {
        if (iVar5 != 1) goto LAB_0010effa;
        pcVar4 = "Probable Success";
      }
    }
    else if (iVar5 == 4) {
      pcVar4 = "Optimization Routine didn\'t converge";
    }
    else {
      if (iVar5 != 0xf) goto LAB_0010effa;
      pcVar4 = "Optimization Routine Encountered Inf/Nan Values";
    }
    printf(pcVar4);
  }
LAB_0010effa:
  puts("\n");
  iVar5 = 0;
  printf("ARIMA Seasonal Order : (%d, %d, %d) * (%d, %d, %d)[%d]\n",(ulong)(uint)obj->p,
         (ulong)(uint)obj->d,(ulong)(uint)obj->q,(ulong)(uint)obj->P,(ulong)(uint)obj->D,
         (ulong)(uint)obj->Q,(ulong)(uint)obj->s);
  putchar(10);
  printf("%-20s%-20s%-20s \n\n","Coefficients","Value","Standard Error");
  if (0 < obj->p) {
    lVar6 = 0;
    do {
      dVar2 = obj->phi[lVar6];
      if (obj->vcov[iVar5] < 0.0) {
        sqrt(obj->vcov[iVar5]);
      }
      lVar1 = lVar6 + 1;
      printf("AR%-15d%-20g%-20g \n",dVar2,(ulong)((int)lVar6 + 1));
      iVar5 = iVar5 + iVar3 + 1;
      lVar6 = lVar1;
    } while (lVar1 < obj->p);
  }
  if (0 < obj->q) {
    lVar6 = 0;
    do {
      iVar5 = (int)lVar6;
      dVar2 = obj->theta[lVar6];
      if (obj->vcov[(obj->p + iVar5) * (iVar3 + 1)] < 0.0) {
        sqrt(obj->vcov[(obj->p + iVar5) * (iVar3 + 1)]);
      }
      lVar6 = lVar6 + 1;
      printf("MA%-15d%-20g%-20g \n",dVar2,(ulong)(iVar5 + 1));
    } while (lVar6 < obj->q);
  }
  if (0 < obj->P) {
    lVar6 = 0;
    do {
      iVar5 = (int)lVar6;
      dVar2 = obj->PHI[lVar6];
      if (obj->vcov[(obj->p + obj->q + iVar5) * (iVar3 + 1)] < 0.0) {
        sqrt(obj->vcov[(obj->p + obj->q + iVar5) * (iVar3 + 1)]);
      }
      lVar6 = lVar6 + 1;
      printf("SAR%-14d%-20g%-20g \n",dVar2,(ulong)(iVar5 + 1));
    } while (lVar6 < obj->P);
  }
  if (0 < obj->Q) {
    lVar6 = 0;
    do {
      iVar5 = (int)lVar6;
      dVar2 = obj->THETA[lVar6];
      if (obj->vcov[(obj->p + obj->q + obj->P + iVar5) * (iVar3 + 1)] < 0.0) {
        sqrt(obj->vcov[(obj->p + obj->q + obj->P + iVar5) * (iVar3 + 1)]);
      }
      lVar6 = lVar6 + 1;
      printf("SMA%-14d%-20g%-20g \n",dVar2,(ulong)(iVar5 + 1));
    } while (lVar6 < obj->Q);
  }
  putchar(10);
  if (obj->M == 1) {
    dVar2 = obj->mean;
    dVar7 = obj->vcov[(iVar3 + 1) * (obj->q + obj->p + obj->P + obj->Q)];
    if (dVar7 < 0.0) {
      dVar7 = sqrt(dVar7);
    }
    else {
      dVar7 = SQRT(dVar7);
    }
    printf("%-17s%-20g%-20g \n",dVar2,dVar7,"MEAN");
  }
  else {
    printf("%-17s%-20g \n",obj->mean,"MEAN");
  }
  putchar(10);
  printf("%-17s%-20g \n",obj->var,"SIGMA^2");
  putchar(10);
  printf("ESTIMATION METHOD : ");
  if ((ulong)(uint)obj->method < 3) {
    printf(*(char **)(&DAT_0015dcf8 + (ulong)(uint)obj->method * 8));
  }
  puts("\n");
  printf("OPTIMIZATION METHOD : ");
  if (obj->method == 2) {
    pcVar4 = "Newton-Raphson";
  }
  else {
    if (7 < (ulong)(uint)obj->optmethod) goto LAB_0010f394;
    pcVar4 = (&PTR_anon_var_dwarf_ce8_0015dda8)[(uint)obj->optmethod];
  }
  printf(pcVar4);
LAB_0010f394:
  puts("\n");
  if ((uint)obj->method < 2) {
    printf("Log Likelihood : %g ",obj->loglik);
  }
  else {
    printf("Log Likelihood : Unavailable ");
  }
  puts("\n");
  if (obj->method == 0) {
    printf("AIC criterion : %g ",obj->aic);
  }
  else {
    printf("AIC Criterion : Unavailable ");
  }
  puts("\n");
  return;
}

Assistant:

void sarima_summary(sarima_object obj) {
	int i,pq,t;
	pq = obj->p + obj->q + obj->P + obj->Q + obj->M;
	if (obj->method == 0 || obj->method == 1) {
		printf("\n\nExit Status \n");
		printf("Return Code : %d \n", obj->retval);
		printf("Exit Message : ");

		if (obj->retval == 0) {
			printf("Input Error");
		}
		else if (obj->retval == 1) {
			printf("Probable Success");
		}
		else if (obj->retval == 4) {
			printf("Optimization Routine didn't converge");
		}
		else if (obj->retval == 15) {
			printf("Optimization Routine Encountered Inf/Nan Values");
		}
	}
	printf("\n\n");
	printf("ARIMA Seasonal Order : (%d, %d, %d) * (%d, %d, %d)[%d]\n",
		obj->p, obj->d, obj->q, obj->P, obj->D ,obj->Q, obj->s);
	printf("\n");

	printf("%-20s%-20s%-20s \n\n", "Coefficients", "Value", "Standard Error");
	for (i = 0; i < obj->p; ++i) {
		printf("AR%-15d%-20g%-20g \n", i + 1, obj->phi[i], sqrt(obj->vcov[i + pq*i]));
	}
	for (i = 0; i < obj->q; ++i) {
		t = obj->p + i;
		printf("MA%-15d%-20g%-20g \n", i + 1, obj->theta[i], sqrt(obj->vcov[t + pq * t]));
	}
	for (i = 0; i < obj->P; ++i) {
		t = obj->p + obj->q + i;
		printf("SAR%-14d%-20g%-20g \n", i + 1, obj->PHI[i], sqrt(obj->vcov[t + pq * t]));
	}
	for (i = 0; i < obj->Q; ++i) {
		t = obj->p + obj->q + obj->P + i;
		printf("SMA%-14d%-20g%-20g \n", i + 1, obj->THETA[i], sqrt(obj->vcov[t + pq * t]));
	}
	printf("\n");
	t = obj->p + obj->q + obj->P + obj->Q;
	if (obj->M == 1) {
		printf("%-17s%-20g%-20g \n", "MEAN", obj->mean, sqrt(obj->vcov[t + pq * t]));
	}
	else {
		printf("%-17s%-20g \n", "MEAN", obj->mean);
	}
	printf("\n");
	printf("%-17s%-20g \n", "SIGMA^2", obj->var);
	printf("\n");
	printf("ESTIMATION METHOD : ");
	if (obj->method == 0) {
		printf("MLE");
	}
	else if (obj->method == 1) {
		printf("CSS");
	}
	else if (obj->method == 2) {
		printf("BOX-JENKINS");
	}
	printf("\n\n");
	printf("OPTIMIZATION METHOD : ");
	if (obj->method == 2) {
		printf("Newton-Raphson");
	}
	else {
		if (obj->optmethod == 0) {
			printf("Nelder-Mead");
		}
		else if (obj->optmethod == 1) {
			printf("Newton Line Search");
		}
		else if (obj->optmethod == 2) {
			printf("Newton Trust Region - Hook Step");
		}
		else if (obj->optmethod == 3) {
			printf("Newton Trust Region - Double Dog-Leg");
		}
		else if (obj->optmethod == 4) {
			printf("Conjugate Gradient");
		}
		else if (obj->optmethod == 5) {
			printf("BFGS");
		}
		else if (obj->optmethod == 6) {
			printf("L-BFGS");
		}
		else if (obj->optmethod == 7) {
			printf("BFGS More-Thuente Line Search");
		}
	}
	printf("\n\n");
	if (obj->method == 0 || obj->method == 1) {
		printf("Log Likelihood : %g ", obj->loglik);
		printf("\n\n");
	}
	else {
		printf("Log Likelihood : Unavailable ");
		printf("\n\n");
	}
	if (obj->method == 0) {
		printf("AIC criterion : %g ", obj->aic);
		printf("\n\n");
	}
	else {
		printf("AIC Criterion : Unavailable ");
		printf("\n\n");
	}
	/*
	printf("EQUATION FORM : x[t] ");
	for (i = 0; i < obj->p; ++i) {
		if (obj->phi[i] > 0) {
			printf("- %g*x[t - %d%s", fabs(obj->phi[i]), i + 1, "]");
		}
		else if (obj->phi[i] < 0) {
			printf("+ %g*x[t - %d%s", fabs(obj->phi[i]), i + 1, "] ");
		}
	}

	printf("=");
	if (obj->mean != 0.0) {
		printf(" %g +", obj->mean);
	}
	printf(" a[t] ");
	for (i = 0; i < obj->q; ++i) {
		if (obj->theta[i] > 0) {
			printf("- %g*a[t - %d%s", fabs(obj->theta[i]), i + 1, "]");
		}
		else if (obj->phi[i] < 0) {
			printf("+ %g*a[t - %d%s", fabs(obj->theta[i]), i + 1, "] ");
		}
	}
	printf("\n\n");
	*/
}